

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

void H3_compute(picnic_instance_t *pp,uint8_t *hash,uint8_t *ch)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  ulong digest_size;
  hash_context ctx;
  
  bVar1 = pp->digest_size;
  digest_size = (ulong)bVar1;
  uVar3 = 0;
  pbVar4 = ch + pp->num_rounds;
  while (ch < pbVar4) {
    if ((uint)bVar1 * 8 <= uVar3) {
      hash_init_prefix(&ctx,digest_size,'\x01');
      hash_update(&ctx,hash,digest_size);
      hash_final(&ctx);
      hash_squeeze(&ctx,hash,digest_size);
      uVar3 = 0;
    }
    bVar2 = hash[uVar3 >> 3] >> ((byte)(6 - ((byte)uVar3 & 7)) & 0x1f);
    if ((~bVar2 & 3) != 0) {
      *ch = bVar2 & 3;
      ch = ch + 1;
    }
    uVar3 = uVar3 + 2;
  }
  return;
}

Assistant:

static void H3_compute(const picnic_instance_t* pp, uint8_t* hash, uint8_t* ch) {
  const unsigned int digest_size      = pp->digest_size;
  const unsigned int digest_size_bits = digest_size << 3;

  // Pick bits from hash
  uint8_t* eof         = ch + pp->num_rounds;
  unsigned int bit_idx = 0;
  while (ch < eof) {
    if (bit_idx >= digest_size_bits) {
      hash_context ctx;
      hash_init_prefix(&ctx, digest_size, HASH_PREFIX_1);
      hash_update(&ctx, hash, digest_size);
      hash_final(&ctx);
      hash_squeeze(&ctx, hash, digest_size);
      hash_clear(&ctx);
      bit_idx = 0;
    }

    const uint8_t twobits = (hash[bit_idx >> 3] >> ((6 - (bit_idx & 0x7)))) & 0x3;
    if (twobits != 0x3) {
      *ch++ = twobits;
    }
    bit_idx += 2;
  }
}